

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.c
# Opt level: O0

void ez_sparse(long i,int_least64_t *ok,long seq)

{
  long low_bits;
  long seq_local;
  int_least64_t *ok_local;
  long i_local;
  
  *ok = i;
  *ok = *ok >> 3;
  *ok = *ok << 2;
  *ok = seq + *ok;
  *ok = *ok << 3;
  *ok = (i & 7U) + *ok;
  return;
}

Assistant:

void
ez_sparse(long i, DSS_HUGE *ok, long seq)
	{
	long low_bits;
	
	*ok = (DSS_HUGE) i;
	low_bits = (long)(i & ((1 << SPARSE_KEEP) - 1));
	*ok = *ok >> SPARSE_KEEP;
	*ok = *ok << SPARSE_BITS;
	*ok += seq;
	*ok = *ok << SPARSE_KEEP;
	*ok += low_bits;
	
	
	return;
	}